

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allphone_search.c
# Opt level: O0

void allphone_search_fill_iter(ps_seg_t *seg,phseg_t *phseg)

{
  char *pcVar1;
  phseg_t *phseg_local;
  ps_seg_t *seg_local;
  
  seg->sf = phseg->sf;
  seg->ef = phseg->ef;
  seg->ascr = phseg->score;
  seg->lscr = phseg->tscore;
  pcVar1 = bin_mdef_ciphone_str(seg->search->acmod->mdef,(int)phseg->ci);
  seg->text = pcVar1;
  seg->wid = -1;
  return;
}

Assistant:

static void
allphone_search_fill_iter(ps_seg_t *seg, phseg_t *phseg)
{
    seg->sf = phseg->sf;
    seg->ef = phseg->ef;
    seg->ascr = phseg->score;
    seg->lscr = phseg->tscore;
    seg->text = bin_mdef_ciphone_str(ps_search_acmod(seg->search)->mdef, phseg->ci);
    seg->wid = BAD_S3WID;
}